

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int64_t GmfStatKwd(int64_t MshIdx,int KwdCod,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list VarArg;
  KwdSct *kwd;
  GmfMshSct *msh;
  int *PtrNmbNod;
  int *PtrDeg;
  int *TypTab;
  int *PtrSolSiz;
  int *PtrNmbTyp;
  int i;
  undefined8 *local_190;
  undefined8 *local_178;
  undefined1 local_118 [16];
  int *local_108;
  int *local_100;
  long local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  uint local_68;
  undefined4 local_64;
  undefined8 *local_60;
  undefined1 *local_58;
  int *local_50;
  long local_48;
  int local_18;
  int local_14;
  long local_10;
  int64_t local_8;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  if ((in_ESI < 1) || (0xf0 < in_ESI)) {
    local_8 = 0;
  }
  else {
    local_50 = (int *)(in_RDI + 0x110 + (long)in_ESI * 0x3300);
    if (*(long *)(local_50 + 0x3f2) == 0) {
      local_8 = 0;
    }
    else {
      if (*local_50 == 3) {
        local_58 = local_118;
        local_60 = (undefined8 *)&stack0x00000008;
        local_64 = 0x30;
        *local_108 = local_50[5];
        *local_100 = local_50[3];
        local_68 = 0x28;
        for (local_18 = 0; local_18 < local_50[5]; local_18 = local_18 + 1) {
          *(int *)(local_f8 + (long)local_18 * 4) = local_50[(long)local_18 + 6];
        }
        local_108 = (int *)in_RDX;
        local_100 = (int *)in_RCX;
        local_f8 = in_R8;
        local_f0 = in_R9;
        local_48 = in_RDI;
        local_14 = in_ESI;
        local_10 = in_RDI;
        iVar1 = strcmp("hr",GmfKwdFmt[in_ESI][2]);
        if (iVar1 == 0) {
          if (local_68 < 0x29) {
            local_178 = (undefined8 *)(local_58 + (int)local_68);
            local_68 = local_68 + 8;
          }
          else {
            local_178 = local_60;
            local_60 = local_60 + 1;
          }
          *(int *)*local_178 = local_50[1];
          if (local_68 < 0x29) {
            local_190 = (undefined8 *)(local_58 + (int)local_68);
          }
          else {
            local_190 = local_60;
          }
          *(int *)*local_190 = local_50[2];
        }
      }
      local_8 = *(int64_t *)(local_50 + 0x3f2);
    }
  }
  return local_8;
}

Assistant:

int64_t GmfStatKwd(int64_t MshIdx, int KwdCod, ...)
{
   int         i, *PtrNmbTyp, *PtrSolSiz, *TypTab, *PtrDeg, *PtrNmbNod;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;
   va_list     VarArg;

   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);

   kwd = &msh->KwdTab[ KwdCod ];

   if(!kwd->NmbLin)
      return(0);

   // Read further arguments if this kw is a sol
   if(kwd->typ == SolKwd)
   {
      va_start(VarArg, KwdCod);

      PtrNmbTyp = va_arg(VarArg, int *);
      *PtrNmbTyp = kwd->NmbTyp;

      PtrSolSiz = va_arg(VarArg, int *);
      *PtrSolSiz = kwd->SolSiz;

      TypTab = va_arg(VarArg, int *);

      for(i=0;i<kwd->NmbTyp;i++)
         TypTab[i] = kwd->TypTab[i];

      // Add two extra paramaters for HO elements: degree and nmb nodes
      if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]) )
      {
         PtrDeg = va_arg(VarArg, int *);
         *PtrDeg = kwd->deg;
         
         PtrNmbNod = va_arg(VarArg, int *);
         *PtrNmbNod = kwd->NmbNod;
      }

      va_end(VarArg);
   }

   return(kwd->NmbLin);
}